

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSim3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *vCexes;
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  char *pcVar7;
  char *local_b8;
  Vec_Ptr_t *vSeqModelVec;
  Ssw_RarPars_t Pars;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  Ssw_RarSetDefaultParams(&Pars);
  local_b8 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_002679d4:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"FWBRSNTGLadivzh"), iVar2 = globalUtilOptind,
        0x60 < iVar1) {
    if (iVar1 < 0x69) {
      if (iVar1 == 0x61) {
        Pars.fSolveAll = Pars.fSolveAll ^ 1;
      }
      else {
        if (iVar1 != 100) goto switchD_002679f9_caseD_43;
        Pars.fDropSatOuts = Pars.fDropSatOuts ^ 1;
      }
    }
    else if (iVar1 == 0x69) {
      Pars.fSetLastState = Pars.fSetLastState ^ 1;
    }
    else if (iVar1 == 0x76) {
      Pars.fVerbose = Pars.fVerbose ^ 1;
    }
    else {
      if (iVar1 != 0x7a) goto switchD_002679f9_caseD_43;
      Pars.fNotVerbose = Pars.fNotVerbose ^ 1;
    }
  }
  switch(iVar1) {
  case 0x42:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-B\" should be followed by an integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nBinSize = iVar1;
LAB_00267b3e:
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_002679f9_caseD_43:
      Abc_Print(-2,"usage: sim3 [-FWBRSNTG num] [-L file] [-advzh]\n");
      Abc_Print(-2,"\t         performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-B num : the number of flops in one bin [default = %d]\n",
                (ulong)(uint)Pars.nBinSize);
      Abc_Print(-2,"\t-R num : the number of simulation rounds [default = %d]\n",
                (ulong)(uint)Pars.nRounds);
      Abc_Print(-2,"\t-S num : the number of rounds before a restart [default = %d]\n",
                (ulong)(uint)Pars.nRestart);
      Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
                (ulong)(uint)Pars.nRandSeed);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)Pars.TimeOut);
      Abc_Print(-2,
                "\t-G num : approximate runtime gap in seconds since the last CEX [default = %d]\n",
                (ulong)(uint)Pars.TimeOutGap);
      pcVar7 = "no logging";
      if (local_b8 != (char *)0x0) {
        pcVar7 = local_b8;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar7);
      pcVar6 = "yes";
      pcVar7 = "yes";
      if (Pars.fSolveAll == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,
                "\t-a     : toggle solving all outputs (do not stop when one is SAT) [default = %s]\n"
                ,pcVar7);
      pcVar7 = "yes";
      if (Pars.fDropSatOuts == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",pcVar7
               );
      pcVar7 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle changing init state to a last rare state [default = %s]\n",
                pcVar7);
      pcVar7 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      if (Pars.fNotVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle suppressing report about solved outputs [default = %s]\n",
                pcVar6);
      pcVar7 = "\t-h     : print the command usage\n";
      iVar2 = -2;
LAB_00267eda:
      Abc_Print(iVar2,pcVar7);
      return 1;
    }
    goto LAB_002679d4;
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x55:
  case 0x56:
    goto switchD_002679f9_caseD_43;
  case 0x46:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFrames = iVar1;
      goto LAB_00267b3e;
    }
    pcVar7 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.TimeOutGap = iVar1;
      goto LAB_00267b3e;
    }
    pcVar7 = "Command line switch \"-G\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_b8 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002679d4;
    }
    pcVar7 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRandSeed = iVar1;
      goto LAB_00267b3e;
    }
    pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRounds = iVar1;
      goto LAB_00267b3e;
    }
    pcVar7 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRestart = iVar1;
      goto LAB_00267b3e;
    }
    pcVar7 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.TimeOut = iVar1;
      goto LAB_00267b3e;
    }
    pcVar7 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  case 0x57:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWords = iVar1;
      goto LAB_00267b3e;
    }
    pcVar7 = "Command line switch \"-W\" should be followed by an integer.\n";
    break;
  default:
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        pcVar7 = "Empty network.\n";
      }
      else if (pAVar3->ntkType == ABC_NTK_STRASH) {
        if (pAVar3->nObjCounts[8] != 0) {
          if (pAVar3->pSeqModel != (Abc_Cex_t *)0x0) {
            free(pAVar3->pSeqModel);
            pAVar3->pSeqModel = (Abc_Cex_t *)0x0;
          }
          iVar2 = Abc_NtkDarSeqSim3(pAVar3,&Pars);
          pAbc->Status = iVar2;
          Abc_FrameReplaceCex(pAbc,&pAVar3->pSeqModel);
          vCexes = pAVar3->vSeqModelVec;
          pAVar3->vSeqModelVec = (Vec_Ptr_t *)0x0;
          vSeqModelVec = vCexes;
          if (Pars.fSetLastState != 0) {
            p = (Vec_Int_t *)pAbc->pNtkCur->pData;
            if (p != (Vec_Int_t *)0x0) {
              pAbc->pNtkCur->pData = (void *)0x0;
              pVVar5 = pAbc->pNtkCur->vBoxes;
              if (0 < pVVar5->nSize) {
                lVar4 = 0;
                do {
                  if ((*(uint *)((long)pVVar5->pArray[lVar4] + 0x14) & 0xf) == 8) {
                    if (p->nSize <= lVar4) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                    }
                    if (p->pArray[lVar4] != 0) {
                      *(undefined8 *)((long)pVVar5->pArray[lVar4] + 0x38) = 2;
                    }
                  }
                  lVar4 = lVar4 + 1;
                  pVVar5 = pAbc->pNtkCur->vBoxes;
                } while (lVar4 < pVVar5->nSize);
              }
              Vec_IntFree(p);
              pAVar3 = Abc_NtkRestrashZero(pAbc->pNtkCur,0);
              if (pAVar3 == (Abc_Ntk_t *)0x0) {
                Abc_Print(-1,"Removing SAT outputs has failed.\n");
                return 1;
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
              pAVar3 = Abc_FrameReadNtk(pAbc);
            }
          }
          if ((Pars.fSolveAll != 0) && (Pars.fDropSatOuts != 0)) {
            if (vCexes == (Vec_Ptr_t *)0x0) {
              pcVar7 = "The array of counter-examples is not available.\n";
            }
            else {
              if (vCexes->nSize == pAVar3->vPos->nSize) {
                Abc_NtkDropSatOutputs(pAVar3,vCexes,Pars.fVerbose);
                pAVar3 = Abc_NtkDarLatchSweep(pAVar3,1,1,1,0,-1,-1,0,0);
                if (pAVar3 == (Abc_Ntk_t *)0x0) {
                  Abc_Print(-1,"Removing SAT outputs has failed.\n");
                  return 1;
                }
                Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                goto LAB_00267fcb;
              }
              pcVar7 = "The array size does not match the number of outputs.\n";
            }
            Abc_Print(1,pcVar7);
          }
LAB_00267fcb:
          if (vSeqModelVec != (Vec_Ptr_t *)0x0) {
            Abc_FrameReplaceCexVec(pAbc,&vSeqModelVec);
            pAbc->nFrames = -1;
          }
          if (local_b8 != (char *)0x0) {
            Abc_NtkWriteLogFile(local_b8,pAbc->pCex,pAbc->Status,pAbc->nFrames,"sim3");
            return 0;
          }
          return 0;
        }
        pcVar7 = "Only works for sequential networks.\n";
      }
      else {
        pcVar7 = "Only works for strashed networks.\n";
      }
      iVar2 = -1;
      goto LAB_00267eda;
    }
    goto switchD_002679f9_caseD_43;
  }
  Abc_Print(-1,pcVar7);
  goto switchD_002679f9_caseD_43;
}

Assistant:

int Abc_CommandSim3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkDarSeqSim3( Abc_Ntk_t * pNtk, Ssw_RarPars_t * pPars );
    Ssw_RarPars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    Vec_Ptr_t * vSeqModelVec;
    char * pLogFileName = NULL;
    int c;
    Ssw_RarSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWBRSNTGLadivzh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBinSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBinSize < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestart < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'a':
            pPars->fSolveAll ^= 1;
            break;
        case 'd':
            pPars->fDropSatOuts ^= 1;
            break;
        case 'i':
            pPars->fSetLastState ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'z':
            pPars->fNotVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "Only works for sequential networks.\n" );
        return 1;
    }
    ABC_FREE( pNtk->pSeqModel );
    pAbc->Status = Abc_NtkDarSeqSim3( pNtk, pPars );
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    vSeqModelVec = pNtk->vSeqModelVec;  pNtk->vSeqModelVec = NULL;
    if ( pPars->fSetLastState && pAbc->pNtkCur->pData )
    {
        Abc_Obj_t * pObj;
        Vec_Int_t * vInit = (Vec_Int_t *)pAbc->pNtkCur->pData;
        pAbc->pNtkCur->pData = NULL;
        Abc_NtkForEachLatch( pAbc->pNtkCur, pObj, c )
            if ( Vec_IntEntry(vInit, c) )
                Abc_LatchSetInit1( pObj );
        Vec_IntFree( vInit );
        pNtkRes = Abc_NtkRestrashZero( pAbc->pNtkCur, 0 );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Removing SAT outputs has failed.\n" );
            return 1;
        }
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        pNtk = Abc_FrameReadNtk(pAbc);
    }
    if ( pPars->fSolveAll && pPars->fDropSatOuts )
    {
        if ( vSeqModelVec == NULL )
            Abc_Print( 1,"The array of counter-examples is not available.\n" );
        else if ( Vec_PtrSize(vSeqModelVec) != Abc_NtkPoNum(pNtk) )
            Abc_Print( 1,"The array size does not match the number of outputs.\n" );
        else
        {
            extern void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose );
            Abc_NtkDropSatOutputs( pNtk, vSeqModelVec, pPars->fVerbose );
            pNtkRes = Abc_NtkDarLatchSweep( pNtk, 1, 1, 1, 0, -1, -1, 0, 0 );
            if ( pNtkRes == NULL )
            {
                Abc_Print( -1, "Removing SAT outputs has failed.\n" );
                return 1;
            }
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        }
    }
    if ( vSeqModelVec )
    {
        Abc_FrameReplaceCexVec( pAbc, &vSeqModelVec );
        pAbc->nFrames = -1;
    }
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "sim3" );
    return 0;

usage:
    Abc_Print( -2, "usage: sim3 [-FWBRSNTG num] [-L file] [-advzh]\n" );
    Abc_Print( -2, "\t         performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n",                         pPars->nFrames );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n",                          pPars->nWords );
    Abc_Print( -2, "\t-B num : the number of flops in one bin [default = %d]\n",                           pPars->nBinSize );
    Abc_Print( -2, "\t-R num : the number of simulation rounds [default = %d]\n",                          pPars->nRounds );
    Abc_Print( -2, "\t-S num : the number of rounds before a restart [default = %d]\n",                    pPars->nRestart );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",                    pPars->nRandSeed );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n",                     pPars->TimeOut );
    Abc_Print( -2, "\t-G num : approximate runtime gap in seconds since the last CEX [default = %d]\n",    pPars->TimeOutGap );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n",                                          pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-a     : toggle solving all outputs (do not stop when one is SAT) [default = %s]\n", pPars->fSolveAll?    "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",             pPars->fDropSatOuts? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle changing init state to a last rare state [default = %s]\n",          pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle suppressing report about solved outputs [default = %s]\n",           pPars->fNotVerbose?  "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}